

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableStruct.cpp
# Opt level: O0

size_t __thiscall adios2::core::StructDefinition::Offset(StructDefinition *this,size_t index)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong in_RSI;
  vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
  *in_RDI;
  allocator local_b9;
  string local_b8 [12];
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  sVar1 = std::
          vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
          ::size(in_RDI);
  if (sVar1 <= in_RSI) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"core",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"VariableStruct::StructDefinition",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,"Offset",(allocator *)&stack0xffffffffffffff6f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"invalid index",&local_b9);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  pvVar2 = std::
           vector<adios2::core::StructDefinition::StructFieldDefinition,_std::allocator<adios2::core::StructDefinition::StructFieldDefinition>_>
           ::operator[](in_RDI,local_10);
  return pvVar2->Offset;
}

Assistant:

size_t StructDefinition::Offset(const size_t index) const
{
    if (index >= m_Definition.size())
    {
        helper::Throw<std::invalid_argument>("core", "VariableStruct::StructDefinition", "Offset",
                                             "invalid index");
    }
    return m_Definition[index].Offset;
}